

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::get_nelems_per_elem(Omega_h *this,Mesh *mesh,Reals *v2m)

{
  Int IVar1;
  void *extraout_RDX;
  double b;
  Reals RVar2;
  Reals complexity;
  Write<double> WStack_48;
  Write<double> local_38;
  Write<double> local_28;
  
  Write<double>::Write(&local_28,&v2m->write_);
  get_complexity_per_elem((Omega_h *)&local_38,mesh,(Reals *)&local_28);
  Write<double>::~Write(&local_28);
  Write<double>::Write(&WStack_48,&local_38);
  IVar1 = Mesh::dim(mesh);
  if (IVar1 == 3) {
    b = 11.919887387328211;
  }
  else {
    b = *(double *)(&DAT_003808e0 + (ulong)(IVar1 == 2) * 8);
  }
  multiply_each_by<double>(this,(Read<double> *)&WStack_48,b);
  Write<double>::~Write(&WStack_48);
  Write<double>::~Write(&local_38);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_nelems_per_elem(Mesh* mesh, Reals v2m) {
  auto complexity = get_complexity_per_elem(mesh, v2m);
  return multiply_each_by(
      complexity, 1.0 / typical_unit_simplex_size(mesh->dim()));
}